

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_hdr_set_version(bcf_hdr_t *hdr,char *version)

{
  bcf_hrec_t *pbVar1;
  char *pcVar2;
  bcf_hdr_t *h;
  int len;
  kstring_t str;
  
  pbVar1 = bcf_hdr_get_hrec(hdr,5,"fileformat",(char *)0x0,(char *)0x0);
  if (pbVar1 == (bcf_hrec_t *)0x0) {
    h = (bcf_hdr_t *)&str;
    str.l = 0;
    str.m = 0;
    str.s = (char *)0x0;
    ksprintf((kstring_t *)h,"##fileformat=%s",version);
    bcf_hdr_parse_line(h,str.s,&len);
    free(str.s);
  }
  else {
    free(pbVar1->value);
    pcVar2 = strdup(version);
    pbVar1->value = pcVar2;
  }
  hdr->dirty = 1;
  return;
}

Assistant:

void bcf_hdr_set_version(bcf_hdr_t *hdr, const char *version)
{
    bcf_hrec_t *hrec = bcf_hdr_get_hrec(hdr, BCF_HL_GEN, "fileformat", NULL, NULL);
    if ( !hrec )
    {
        int len;
        kstring_t str = {0,0,0};
        ksprintf(&str,"##fileformat=%s", version);
        hrec = bcf_hdr_parse_line(hdr, str.s, &len);
        free(str.s);
    }
    else
    {
        free(hrec->value);
        hrec->value = strdup(version);
    }
    hdr->dirty = 1;
}